

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O2

void __thiscall MeshLib::SolidDelegate::removeHalfedge(SolidDelegate *this,Solid *pS,HalfEdge *he)

{
  Edge *__filename;
  TopologyException *this_00;
  
  __filename = he->m_edge;
  if (__filename->m_halfedge[0] == he) {
    __filename->m_halfedge[0] = __filename->m_halfedge[1];
  }
  else if (__filename->m_halfedge[1] != he) {
    this_00 = (TopologyException *)__cxa_allocate_exception(8);
    TopologyException::TopologyException(this_00,"SolidDelegate");
    __cxa_throw(this_00,&TopologyException::typeinfo,TopologyException::~TopologyException);
  }
  __filename->m_halfedge[1] = (HalfEdge *)0x0;
  if (he->m_face->m_halfedge == he) {
    he->m_face->m_halfedge = (HalfEdge *)0x0;
  }
  if (he->m_trait != (Trait *)0x0) {
    Trait::clear(&he->m_trait);
  }
  if ((__filename->m_halfedge[0] == (HalfEdge *)0x0) &&
     (__filename->m_halfedge[1] == (HalfEdge *)0x0)) {
    if (__filename->m_trait != (Trait *)0x0) {
      Trait::clear(&__filename->m_trait);
    }
    AVL::Tree<MeshLib::Edge>::remove(&pS->m_edges,(char *)__filename);
    std::__cxx11::string::~string((string *)&__filename->m_string);
    operator_delete(__filename);
  }
  std::__cxx11::string::~string((string *)&he->m_string);
  operator_delete(he);
  return;
}

Assistant:

void SolidDelegate::removeHalfedge(Solid *pS,  HalfEdge * he )
{
	//he->edge
	Edge * edge = he->edge();

	if( edge->halfedge(0) == he )
	{
		edge->halfedge(0) = edge->halfedge(1);
		edge->halfedge(1) = NULL;
	}
	else
	{
		if( edge->halfedge(1) != he ) throw TopologyException("SolidDelegate");
		edge->halfedge(1) = NULL;
	}

	
	//he->face
	if( he->face()->halfedge() == he )
	{
		he->face()->halfedge() = NULL;
	}

	if( he->trait() != NULL )
	{
		Trait::clear(  he->trait() );
	}
	//
	if( edge->halfedge(0) == NULL && edge->halfedge(1) == NULL )
	{
		if( edge->trait() != NULL )
		{
			Trait::clear( edge->trait() );
		}
		pS->m_edges.remove( edge );
		delete edge;
		edge = NULL;
	}
	delete he;
}